

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O0

DdNode * Llb_Nonlin4ComputeCube
                   (DdManager *dd,Aig_Man_t *pAig,Vec_Int_t *vOrder,char *pValues,int Flag)

{
  abctime aVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  DdNode *n;
  abctime TimeStop;
  int i;
  DdNode *bTemp;
  DdNode *bVar;
  DdNode *bRes;
  Aig_Obj_t *pObjTemp;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObjLo;
  int Flag_local;
  char *pValues_local;
  Vec_Int_t *vOrder_local;
  Aig_Man_t *pAig_local;
  DdManager *dd_local;
  
  aVar1 = dd->TimeStop;
  dd->TimeStop = 0;
  bVar = Cudd_ReadOne(dd);
  Cudd_Ref(bVar);
  for (TimeStop._4_4_ = 0; iVar2 = Saig_ManRegNum(pAig), TimeStop._4_4_ < iVar2;
      TimeStop._4_4_ = TimeStop._4_4_ + 1) {
    pAVar3 = Saig_ManLi(pAig,TimeStop._4_4_);
    pObjLi = Saig_ManLo(pAig,TimeStop._4_4_);
    pObjTemp = pAVar3;
    if (Flag != 0) {
      pObjTemp = pObjLi;
      pObjLi = pAVar3;
    }
    iVar2 = Llb_ObjBddVar(vOrder,pObjTemp);
    bTemp = Cudd_bddIthVar(dd,iVar2);
    iVar2 = Llb_ObjBddVar(vOrder,pObjLi);
    if (pValues[iVar2] != '\x01') {
      bTemp = (DdNode *)((ulong)bTemp ^ 1);
    }
    n = Cudd_bddAnd(dd,bVar,bTemp);
    Cudd_Ref(n);
    Cudd_RecursiveDeref(dd,bVar);
    bVar = n;
  }
  Cudd_Deref(bVar);
  dd->TimeStop = aVar1;
  return bVar;
}

Assistant:

DdNode * Llb_Nonlin4ComputeCube( DdManager * dd, Aig_Man_t * pAig, Vec_Int_t * vOrder, char * pValues, int Flag )
{
    Aig_Obj_t * pObjLo, * pObjLi, * pObjTemp;
    DdNode * bRes, * bVar, * bTemp;
    int i;
    abctime TimeStop;
    TimeStop = dd->TimeStop;  dd->TimeStop = 0;
    bRes = Cudd_ReadOne( dd );   Cudd_Ref( bRes );
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
    {
        if ( Flag )
            pObjTemp = pObjLo, pObjLo = pObjLi, pObjLi = pObjTemp;
        // get the correspoding flop input variable
        bVar = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObjLi) );
        if ( pValues[Llb_ObjBddVar(vOrder, pObjLo)] != 1 )
            bVar = Cudd_Not(bVar);
        // create cube
        bRes = Cudd_bddAnd( dd, bTemp = bRes, bVar );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bRes );
    dd->TimeStop = TimeStop;
    return bRes;
}